

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

int main(void)

{
  pointer *this;
  long lVar1;
  initializer_list<Node> __l;
  Node node;
  allocator_type local_e9;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  vector<Node,_std::allocator<Node>_> local_c0;
  Node local_a8;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined4 local_48;
  pointer local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"apple","");
  local_c8 = 3;
  local_a8.key._M_dataplus._M_p = (pointer)&local_a8.key.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"banana","");
  local_a8.value = 7;
  local_68[0] = local_58;
  local_a8.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"cherry","");
  local_48 = 0xb;
  local_40 = (pointer)0x0;
  uStack_38 = 0;
  local_30 = 0;
  __l._M_len = 2;
  __l._M_array = &local_a8;
  std::vector<Node,_std::allocator<Node>_>::vector(&local_c0,__l,&local_e9);
  lVar1 = -0x80;
  this = &local_40;
  do {
    std::vector<Node,_std::allocator<Node>_>::~vector((vector<Node,_std::allocator<Node>_> *)this);
    if ((pointer)(this + -3) != this[-5]) {
      operator_delete(this[-5]);
    }
    this = this + -8;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0);
  (*Node::Reflection.super_TypeDescriptor._vptr_TypeDescriptor[3])(&Node::Reflection,local_e8,0);
  std::vector<Node,_std::allocator<Node>_>::~vector(&local_c0);
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0]);
  }
  return 0;
}

Assistant:

int main() {
    // Create an object of type Node
    Node node = {"apple", 3, {{"banana", 7, {}}, {"cherry", 11, {}}}};

    // Find Node's type descriptor
    reflect::TypeDescriptor* typeDesc = reflect::TypeResolver<Node>::get();

    // Dump a description of the Node object to the console
    typeDesc->dump(&node);

    return 0;
}